

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarFindTabByID(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  ImGuiID in_ESI;
  ImVector<ImGuiTabItem> *in_RDI;
  int n;
  int local_18;
  
  if (in_ESI != 0) {
    for (local_18 = 0; local_18 < in_RDI->Size; local_18 = local_18 + 1) {
      pIVar1 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_18);
      if (pIVar1->ID == in_ESI) {
        pIVar1 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_18);
        return pIVar1;
      }
    }
  }
  return (ImGuiTabItem *)0x0;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindTabByID(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (tab_id != 0)
        for (int n = 0; n < tab_bar->Tabs.Size; n++)
            if (tab_bar->Tabs[n].ID == tab_id)
                return &tab_bar->Tabs[n];
    return NULL;
}